

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O1

void __thiscall
TwoStageDynamicBayesianNetwork::ComputeWithinNextStageClosure
          (TwoStageDynamicBayesianNetwork *this,Scope *Y,Scope *O)

{
  uint *puVar1;
  pointer pSVar2;
  iterator iVar3;
  bool bVar4;
  ulong uVar5;
  Index *pIVar6;
  ulong uVar7;
  uint *puVar8;
  bool bVar9;
  Index local_4c;
  Index local_48;
  Index local_44;
  uint *local_40;
  uint *local_38;
  
  do {
    puVar1 = (Y->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar9 = true;
    for (puVar8 = (Y->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1) {
      uVar7 = (ulong)*puVar8;
      pSVar2 = (this->_m_YSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->_m_YSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) * -0x5555555555555555;
      if (uVar5 < uVar7 || uVar5 - uVar7 == 0) goto LAB_00489840;
      pIVar6 = *(Index **)
                &pSVar2[uVar7].super_SDT.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
      if (pIVar6 != *(pointer *)
                     ((long)&pSVar2[uVar7].super_SDT.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     + 8)) {
        do {
          bVar4 = Scope::Contains(Y,*pIVar6);
          if (!bVar4) {
            local_4c = *pIVar6;
            iVar3._M_current =
                 (Y->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (Y->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)Y,iVar3,&local_4c);
            }
            else {
              *iVar3._M_current = local_4c;
              (Y->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            bVar9 = false;
          }
          pIVar6 = pIVar6 + 1;
        } while (pIVar6 != *(pointer *)
                            ((long)&pSVar2[uVar7].super_SDT.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + 8));
      }
    }
    puVar8 = (O->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_40 = (O->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (puVar8 != local_40) {
      do {
        uVar7 = (ulong)*puVar8;
        pSVar2 = (this->_m_YSoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = ((long)(this->_m_YSoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) * -0x5555555555555555;
        if (uVar5 < uVar7 || uVar5 - uVar7 == 0) {
LAB_00489840:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        pIVar6 = *(Index **)
                  &pSVar2[uVar7].super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
        local_38 = puVar8;
        if (pIVar6 != *(pointer *)
                       ((long)&pSVar2[uVar7].super_SDT.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl + 8)) {
          do {
            bVar4 = Scope::Contains(Y,*pIVar6);
            if (!bVar4) {
              local_48 = *pIVar6;
              iVar3._M_current =
                   (Y->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (Y->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)Y,iVar3,&local_48);
              }
              else {
                *iVar3._M_current = local_48;
                (Y->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              bVar9 = false;
            }
            pIVar6 = pIVar6 + 1;
          } while (pIVar6 != *(pointer *)
                              ((long)&pSVar2[uVar7].super_SDT.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl + 8));
        }
        pSVar2 = (this->_m_OSoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = ((long)(this->_m_OSoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pSVar2 >> 3) * -0x5555555555555555;
        if (uVar5 < uVar7 || uVar5 - uVar7 == 0) goto LAB_00489840;
        pIVar6 = *(Index **)
                  &pSVar2[uVar7].super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
        if (pIVar6 != *(pointer *)
                       ((long)&pSVar2[uVar7].super_SDT.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl + 8)) {
          do {
            bVar4 = Scope::Contains(O,*pIVar6);
            if (!bVar4) {
              local_44 = *pIVar6;
              iVar3._M_current =
                   (O->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (O->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)O,iVar3,&local_44);
              }
              else {
                *iVar3._M_current = local_44;
                (O->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              bVar9 = false;
            }
            pIVar6 = pIVar6 + 1;
          } while (pIVar6 != *(pointer *)
                              ((long)&pSVar2[uVar7].super_SDT.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl + 8));
        }
        puVar8 = local_38 + 1;
      } while (puVar8 != local_40);
    }
    if (bVar9) {
      return;
    }
  } while( true );
}

Assistant:

void TwoStageDynamicBayesianNetwork::
ComputeWithinNextStageClosure(Scope& Y, Scope& O) const
{    
    bool converged = true;
    do{
        converged = true;
        //check all Y for non-included Y dependencies
        Scope::const_iterator s_it = Y.begin();
        Scope::const_iterator s_last = Y.end();
        while(s_it != s_last)
        {
            Index yI = *s_it;
            const Scope& y_YSoI = _m_YSoI_Y.at(yI);
            for(Scope::const_iterator oy_it = y_YSoI.begin(); 
                    oy_it != y_YSoI.end(); oy_it++)
                //yI has other Y (oyI = *oy_it) that point to it...
                //let's see if they are in Y already.
                if(! Y.Contains( *oy_it ) )
                {
                    converged = false;
                    Y.Insert(*oy_it);
                }
            s_it++;
        }
        
        //check all O for non-included O and Y dependencies
        Scope::const_iterator o_it = O.begin();
        Scope::const_iterator o_last = O.end();
        while(o_it != o_last)
        {
            Index oI = *o_it;
            const Scope& o_YSoI = _m_YSoI_O.at(oI);
            for(Scope::const_iterator oy_it = o_YSoI.begin(); 
                oy_it != o_YSoI.end(); oy_it++)
                //oI has other Y (oyI = *oy_it) that point to it...
                //let's see if they are in Y already.
                if(! Y.Contains( *oy_it ) )
                {
                    converged = false;
                    Y.Insert(*oy_it);
                }

            const Scope& o_OSoI = _m_OSoI_O.at(oI);
            for(Scope::const_iterator oo_it = o_OSoI.begin(); 
                oo_it != o_OSoI.end(); oo_it++)
                //oI has other O (ooI = *oo_it) that point to it...
                //let's see if they are in O already.
                if(! O.Contains( *oo_it ) )
                {
                    converged = false;
                    O.Insert(*oo_it);
                }


            o_it++;
        }

    }while (! converged );
}